

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void matras_destroy_read_view(matras *m,matras_view *v)

{
  matras_id_t mVar1;
  matras_id_t mVar2;
  uint uVar3;
  matras_view *pmVar4;
  matras_view *pmVar5;
  void *ext;
  void *pvVar6;
  void *ext_00;
  bool bVar7;
  void **extent3;
  void **extent2p;
  void **extent2n;
  void **extent2;
  int local_58;
  matras_id_t ptrs_in_ext;
  matras_id_t j2;
  matras_id_t i2;
  matras_id_t j1;
  matras_id_t i1;
  matras_id_t step2;
  matras_id_t step1;
  void **extent1p;
  void **extent1n;
  void **extent1;
  matras_view *prev_view;
  matras_view *next_view;
  matras_view *v_local;
  matras *m_local;
  
  if ((matras *)v == m) {
    __assert_fail("v != &m->head",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x18b,"void matras_destroy_read_view(struct matras *, struct matras_view *)");
  }
  if (v->next_view != (matras_view *)0x0) {
    pmVar4 = v->next_view;
    pmVar5 = v->prev_view;
    pmVar4->prev_view = pmVar5;
    if (pmVar5 != (matras_view *)0x0) {
      pmVar5->next_view = pmVar4;
    }
    v->next_view = (matras_view *)0x0;
    if (((v->block_count != 0) && ((v->root != pmVar4->root || (pmVar4->block_count == 0)))) &&
       ((pmVar5 == (matras_view *)0x0 || ((v->root != pmVar5->root || (pmVar5->block_count == 0)))))
       ) {
      ext = v->root;
      pvVar6 = pmVar4->root;
      _step2 = (void *)0x0;
      if (pmVar5 != (matras_view *)0x0) {
        _step2 = pmVar5->root;
      }
      mVar1 = m->mask1;
      mVar2 = m->mask2;
      i2 = 0;
      j2 = 0;
      uVar3 = m->extent_size;
      for (; (ulong)j2 < v->block_count; j2 = mVar1 + 1 + j2) {
        ext_00 = *(void **)((long)ext + (ulong)i2 * 8);
        extent2p = (void **)0x0;
        extent3 = (void **)0x0;
        if ((ulong)j2 < pmVar4->block_count) {
          if (*(long *)((long)ext + (ulong)i2 * 8) != *(long *)((long)pvVar6 + (ulong)i2 * 8)) {
            extent2p = *(void ***)((long)pvVar6 + (ulong)i2 * 8);
            goto LAB_00103c9c;
          }
        }
        else {
LAB_00103c9c:
          if ((pmVar5 != (matras_view *)0x0) && ((ulong)j2 < pmVar5->block_count)) {
            if (*(long *)((long)ext + (ulong)i2 * 8) == *(long *)((long)_step2 + (ulong)i2 * 8))
            goto LAB_00103dc5;
            extent3 = *(void ***)((long)_step2 + (ulong)i2 * 8);
          }
          local_58 = 0;
          ptrs_in_ext = 0;
          while( true ) {
            bVar7 = false;
            if (ptrs_in_ext < uVar3 >> 3) {
              bVar7 = (ulong)(j2 + local_58) < v->block_count;
            }
            if (!bVar7) break;
            if (((pmVar4->block_count <= (ulong)(j2 + local_58)) ||
                (*(void **)((long)ext_00 + (ulong)ptrs_in_ext * 8) != extent2p[ptrs_in_ext])) &&
               ((pmVar5 == (matras_view *)0x0 ||
                ((pmVar5->block_count <= (ulong)(j2 + local_58) ||
                 (*(void **)((long)ext_00 + (ulong)ptrs_in_ext * 8) != extent3[ptrs_in_ext])))))) {
              matras_free_read_view_extent(m,*(void **)((long)ext_00 + (ulong)ptrs_in_ext * 8));
            }
            ptrs_in_ext = ptrs_in_ext + 1;
            local_58 = mVar2 + 1 + local_58;
          }
          matras_free_read_view_extent(m,ext_00);
        }
LAB_00103dc5:
        i2 = i2 + 1;
      }
      matras_free_read_view_extent(m,ext);
    }
  }
  return;
}

Assistant:

void
matras_destroy_read_view(struct matras *m, struct matras_view *v)
{
	assert(v != &m->head);
	if (!v->next_view)
		return;
	struct matras_view *next_view = v->next_view;
	struct matras_view *prev_view = v->prev_view;
	next_view->prev_view = prev_view;
	if (prev_view)
		prev_view->next_view = next_view;
	v->next_view = 0;

	if (v->block_count == 0)
		return;
	if (v->root == next_view->root && next_view->block_count)
		return;
	if (prev_view && v->root == prev_view->root && prev_view->block_count)
		return;
	void **extent1 = (void **)v->root;
	void **extent1n = (void **) next_view->root;
	void **extent1p = 0;
	if (prev_view)
		extent1p = (void **) prev_view->root;
	matras_id_t step1 = m->mask1 + 1;
	matras_id_t step2 = m->mask2 + 1;
	matras_id_t i1 = 0, j1 = 0, i2, j2;
	matras_id_t ptrs_in_ext = m->extent_size / (matras_id_t)sizeof(void *);
	for (; j1 < v->block_count; i1++, j1 += step1) {
		void **extent2 = (void **)extent1[i1];
		void **extent2n = 0;
		void **extent2p = 0;
		if (next_view->block_count > j1) {
			if (extent1[i1] == extent1n[i1])
				continue;
			extent2n = (void **) extent1n[i1];
		}
		if (prev_view && prev_view->block_count > j1) {
			if (extent1[i1] == extent1p[i1])
				continue;
			extent2p = (void **) extent1p[i1];
		}
		for (i2 = j2 = 0;
		     i2 < ptrs_in_ext && j1 + j2 < v->block_count;
		     i2++, j2 += step2) {
			void **extent3 = (void **)extent2[i2];
			if (next_view->block_count > j1 + j2) {
				if (extent2[i2] == extent2n[i2])
					continue;
			}
			if (prev_view && prev_view->block_count > j1 + j2) {
				if (extent2[i2] == extent2p[i2])
					continue;
			}
			matras_free_read_view_extent(m, extent3);
		}
		matras_free_read_view_extent(m, extent2);
	}
	matras_free_read_view_extent(m, extent1);
}